

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.h
# Opt level: O0

void __thiscall
slang::ast::CallExpression::visitExprsNoArgs<slang::analysis::DataFlowAnalysis&>
          (CallExpression *this,DataFlowAnalysis *visitor)

{
  bool bVar1;
  Expression *pEVar2;
  variant_alternative_t<1UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *pvVar3;
  char *pcVar4;
  variant_alternative_t<1UL,_variant<monostate,_IteratorCallInfo,_RandomizeCallInfo>_> *pvVar5;
  char *pcVar6;
  variant_alternative_t<2UL,_variant<monostate,_IteratorCallInfo,_RandomizeCallInfo>_> *pvVar7;
  int __c;
  int __c_00;
  char *in_RSI;
  CallExpression *in_RDI;
  Constraint *constraints;
  Expression *iterExpr;
  variant<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
  *extra;
  DataFlowAnalysis *in_stack_ffffffffffffffc8;
  Constraint *in_stack_ffffffffffffffe0;
  
  pcVar6 = in_RSI;
  pEVar2 = thisClass(in_RDI);
  if (pEVar2 != (Expression *)0x0) {
    thisClass(in_RDI);
    Expression::visit<slang::analysis::DataFlowAnalysis&>
              (&in_RDI->super_Expression,in_stack_ffffffffffffffc8);
    pcVar6 = in_RSI;
  }
  bVar1 = isSystemCall((CallExpression *)0x85d8d4);
  if (bVar1) {
    pvVar3 = std::
             get<1ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                       ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                         *)0x85d8eb);
    pcVar4 = std::
             variant<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
             ::index(&pvVar3->extraInfo,pcVar6,__c);
    if (pcVar4 == (char *)0x1) {
      pvVar5 = std::
               get<1ul,std::monostate,slang::ast::CallExpression::IteratorCallInfo,slang::ast::CallExpression::RandomizeCallInfo>
                         ((variant<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                           *)0x85d90e);
      if (pvVar5->iterExpr != (Expression *)0x0) {
        Expression::visit<slang::analysis::DataFlowAnalysis&>
                  (&in_RDI->super_Expression,in_stack_ffffffffffffffc8);
      }
    }
    else {
      pcVar6 = std::
               variant<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
               ::index(&pvVar3->extraInfo,pcVar6,__c_00);
      if (pcVar6 == (char *)0x2) {
        pvVar7 = std::
                 get<2ul,std::monostate,slang::ast::CallExpression::IteratorCallInfo,slang::ast::CallExpression::RandomizeCallInfo>
                           ((variant<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                             *)0x85d949);
        if ((DataFlowAnalysis *)pvVar7->inlineConstraints != (DataFlowAnalysis *)0x0) {
          Constraint::visit<slang::analysis::DataFlowAnalysis>
                    (in_stack_ffffffffffffffe0,(DataFlowAnalysis *)pvVar7->inlineConstraints);
        }
      }
    }
  }
  return;
}

Assistant:

void visitExprsNoArgs(TVisitor&& visitor) const {
        if (thisClass())
            thisClass()->visit(visitor);

        if (isSystemCall()) {
            auto& extra = std::get<1>(subroutine).extraInfo;
            if (extra.index() == 1) {
                if (auto iterExpr = std::get<1>(extra).iterExpr)
                    iterExpr->visit(visitor);
            }
            else if (extra.index() == 2) {
                if (auto constraints = std::get<2>(extra).inlineConstraints)
                    constraints->visit(visitor);
            }
        }
    }